

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O2

void __thiscall QTuioHandler::process2DObjSet(QTuioHandler *this,QOscMessage *message)

{
  QVariant *pQVar1;
  int iVar2;
  QDebug *pQVar3;
  iterator iVar4;
  iterator iVar5;
  QTuioToken *this_00;
  long in_FS_OFFSET;
  float t;
  float t_00;
  float t_01;
  float t_02;
  float t_03;
  float t_04;
  float t_05;
  float t_06;
  int id;
  int local_8c;
  undefined1 local_88 [28];
  undefined8 uStack_6c;
  undefined4 local_64;
  char *local_60;
  QDebug local_58;
  QArrayDataPointer<QVariant> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d = (message->m_arguments).d.d;
  pQVar1 = (message->m_arguments).d.ptr;
  local_50.size = (message->m_arguments).d.size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_50.ptr = pQVar1;
  if ((ulong)local_50.size < 7) {
    lcTuioSet();
    if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0)
    goto LAB_00109e69;
    local_88._16_4_ = 2;
    local_88._20_8_ = 0;
    uStack_6c = 0;
    local_64 = 0;
    local_60 = lcTuioSet::category.name;
    QMessageLogger::warning();
    pQVar3 = QDebug::operator<<(&local_58,
                                "Ignoring malformed TUIO set message with too few arguments: ");
    QDebug::operator<<(pQVar3,local_50.size);
  }
  else {
    iVar2 = QVariant::typeId(pQVar1 + 1);
    if (iVar2 == 2) {
      iVar2 = QVariant::typeId(pQVar1 + 2);
      if (iVar2 == 2) {
        iVar2 = QVariant::typeId(pQVar1 + 3);
        if (iVar2 == 0x26) {
          iVar2 = QVariant::typeId(pQVar1 + 4);
          if (iVar2 == 0x26) {
            iVar2 = QVariant::typeId(pQVar1 + 5);
            if (iVar2 == 0x26) {
              iVar2 = QVariant::typeId(pQVar1 + 6);
              if (iVar2 == 0x26) {
                iVar2 = QVariant::typeId(pQVar1 + 7);
                if (iVar2 == 0x26) {
                  iVar2 = QVariant::typeId(pQVar1 + 8);
                  if (iVar2 == 0x26) {
                    iVar2 = QVariant::typeId(pQVar1 + 9);
                    if (iVar2 == 0x26) {
                      iVar2 = QVariant::typeId(pQVar1 + 10);
                      if (iVar2 == 0x26) {
                        local_8c = QVariant::toInt((bool *)(pQVar1 + 1));
                        iVar2 = QVariant::toInt((bool *)(pQVar1 + 2));
                        t = (float)QVariant::toFloat((bool *)(pQVar1 + 3));
                        t_00 = (float)QVariant::toFloat((bool *)(pQVar1 + 4));
                        t_01 = (float)QVariant::toFloat((bool *)(pQVar1 + 5));
                        t_02 = (float)QVariant::toFloat((bool *)(pQVar1 + 6));
                        t_03 = (float)QVariant::toFloat((bool *)(pQVar1 + 7));
                        t_04 = (float)QVariant::toFloat((bool *)(pQVar1 + 8));
                        t_05 = (float)QVariant::toFloat((bool *)(pQVar1 + 9));
                        t_06 = (float)QVariant::toFloat((bool *)(pQVar1 + 10));
                        iVar4 = QMap<int,_QTuioToken>::find
                                          ((QMap<int,_QTuioToken> *)(this + 0x48),&local_8c);
                        iVar5._M_node =
                             (_Base_ptr)
                             QMap<int,_QTuioToken>::end((QMap<int,_QTuioToken> *)(this + 0x48));
                        lcTuioSet();
                        if (iVar4.i._M_node != (iterator)iVar5._M_node) {
                          if (((byte)lcTuioSet::category.field_2.bools.enabledDebug._q_value._M_base
                                     ._M_i & 1) != 0) {
                            local_88._16_4_ = 2;
                            local_88._20_8_ = 0;
                            uStack_6c = 0;
                            local_64 = 0;
                            local_60 = lcTuioSet::category.name;
                            QMessageLogger::debug();
                            pQVar3 = QDebug::operator<<(&local_58,"Processing SET for token ");
                            pQVar3 = QDebug::operator<<(pQVar3,iVar2);
                            pQVar3 = QDebug::operator<<(pQVar3,local_8c);
                            pQVar3 = QDebug::operator<<(pQVar3," @ ");
                            pQVar3 = QDebug::operator<<(pQVar3,t);
                            pQVar3 = QDebug::operator<<(pQVar3,t_00);
                            pQVar3 = QDebug::operator<<(pQVar3," angle: ");
                            pQVar3 = QDebug::operator<<(pQVar3,t_01);
                            pQVar3 = QDebug::operator<<(pQVar3,"vel");
                            pQVar3 = QDebug::operator<<(pQVar3,t_02);
                            pQVar3 = QDebug::operator<<(pQVar3,t_03);
                            pQVar3 = QDebug::operator<<(pQVar3,t_04);
                            pQVar3 = QDebug::operator<<(pQVar3,"acc");
                            pQVar3 = QDebug::operator<<(pQVar3,t_05);
                            QDebug::operator<<(pQVar3,t_06);
                            QDebug::~QDebug(&local_58);
                          }
                          this_00 = (QTuioToken *)((long)iVar4.i._M_node + 0x24);
                          *(int *)((long)iVar4.i._M_node + 0x28) = iVar2;
                          QTuioToken::setX(this_00,t);
                          QTuioToken::setY(this_00,t_00);
                          *(float *)((long)iVar4.i._M_node + 0x34) = t_02;
                          *(float *)((long)iVar4.i._M_node + 0x38) = t_03;
                          *(float *)((long)iVar4.i._M_node + 0x3c) = t_05;
                          QTuioToken::setAngle(this_00,t_01);
                          *(float *)((long)iVar4.i._M_node + 0x44) = t_06;
                          *(float *)((long)iVar4.i._M_node + 0x48) = t_06;
                          goto LAB_00109e69;
                        }
                        if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base
                                   ._M_i & 1) == 0) goto LAB_00109e69;
                        local_88._16_4_ = 2;
                        local_88._20_8_ = 0;
                        uStack_6c = 0;
                        local_64 = 0;
                        local_60 = lcTuioSet::category.name;
                        QMessageLogger::warning();
                        pQVar3 = QDebug::operator<<(&local_58,
                                                                                                        
                                                  "Ignoring malformed TUIO set for nonexistent token "
                                                  );
                        QDebug::operator<<(pQVar3,iVar2);
                        goto LAB_00109f0c;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    lcTuioSet();
    if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0)
    goto LAB_00109e69;
    local_88._16_4_ = 2;
    local_88._20_8_ = 0;
    uStack_6c = 0;
    local_64 = 0;
    local_60 = lcTuioSet::category.name;
    QMessageLogger::warning();
    pQVar3 = QDebug::operator<<(&local_58,"Ignoring malformed TUIO set message with bad types: ");
    local_88._0_8_ = pQVar3->stream;
    *(int *)(local_88._0_8_ + 0x28) = *(int *)(local_88._0_8_ + 0x28) + 1;
    operator<<((Stream *)(local_88 + 8),(QList<QVariant> *)local_88);
    QDebug::~QDebug((QDebug *)(local_88 + 8));
    QDebug::~QDebug((QDebug *)local_88);
  }
LAB_00109f0c:
  QDebug::~QDebug(&local_58);
LAB_00109e69:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTuioHandler::process2DObjSet(const QOscMessage &message)
{
    QList<QVariant> arguments = message.arguments();
    if (arguments.size() < 7) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with too few arguments: " << arguments.size();
        return;
    }

    if (QMetaType::Type(arguments.at(1).userType()) != QMetaType::Int ||
            QMetaType::Type(arguments.at(2).userType()) != QMetaType::Int ||
            QMetaType::Type(arguments.at(3).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(4).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(5).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(6).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(7).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(8).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(9).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(10).userType()) != QMetaType::Float) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with bad types: " << arguments;
        return;
    }

    int id = arguments.at(1).toInt();
    int classId = arguments.at(2).toInt();
    float x = arguments.at(3).toFloat();
    float y = arguments.at(4).toFloat();
    float angle = arguments.at(5).toFloat();
    float vx = arguments.at(6).toFloat();
    float vy = arguments.at(7).toFloat();
    float angularVelocity = arguments.at(8).toFloat();
    float acceleration = arguments.at(9).toFloat();
    float angularAcceleration = arguments.at(10).toFloat();

    QMap<int, QTuioToken>::Iterator it = m_activeTokens.find(id);
    if (it == m_activeTokens.end()) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set for nonexistent token " << classId;
        return;
    }

    qCDebug(lcTuioSet) << "Processing SET for token " << classId << id << " @ " << x << y << " angle: " << angle <<
                          "vel" << vx << vy << angularVelocity << "acc" << acceleration << angularAcceleration;
    QTuioToken &tok = *it;
    tok.setClassId(classId);
    tok.setX(x);
    tok.setY(y);
    tok.setVX(vx);
    tok.setVY(vy);
    tok.setAcceleration(acceleration);
    tok.setAngle(angle);
    tok.setAngularVelocity(angularAcceleration);
    tok.setAngularAcceleration(angularAcceleration);
}